

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O2

int it_xm_make_envelope(IT_ENVELOPE *envelope,unsigned_short *data,int y_offset)

{
  byte bVar1;
  ulong uVar2;
  ushort uVar3;
  
  bVar1 = envelope->n_nodes;
  if (0xc < bVar1) {
    envelope->n_nodes = '\f';
    bVar1 = 0xc;
  }
  if (0xb < envelope->sus_loop_start) {
    envelope->flags = envelope->flags & 0xfb;
  }
  if (envelope->loop_end < 0xc) {
    if (envelope->loop_start < envelope->loop_end) goto LAB_00639cba;
  }
  else {
    envelope->loop_end = '\0';
  }
  envelope->flags = envelope->flags & 0xfd;
LAB_00639cba:
  for (uVar2 = 0; uVar2 < bVar1; uVar2 = uVar2 + 1) {
    envelope->node_t[uVar2] = data[uVar2 * 2];
    uVar3 = data[uVar2 * 2 + 1];
    if (0x3f < uVar3) {
      uVar3 = 0x40;
    }
    envelope->node_y[uVar2] = (char)uVar3 + (char)y_offset;
  }
  return (int)bVar1;
}

Assistant:

static int it_xm_make_envelope(IT_ENVELOPE *envelope, const unsigned short *data, int y_offset)
{
    int i, pos, val;

	if (envelope->n_nodes > 12) {
		/* XXX
		TRACE("XM error: wrong number of envelope nodes (%d)\n", envelope->n_nodes);
		envelope->n_nodes = 0;
		return -1; */
		envelope->n_nodes = 12;
	}

	if (envelope->sus_loop_start >= 12) envelope->flags &= ~IT_ENVELOPE_SUSTAIN_LOOP;
	if (envelope->loop_end >= 12) envelope->loop_end = 0;
	if (envelope->loop_start >= envelope->loop_end) envelope->flags &= ~IT_ENVELOPE_LOOP_ON;

	pos = 0;
	for (i = 0; i < envelope->n_nodes; i++) {
		envelope->node_t[i] = data[pos++];
        val = data[pos++];
        if (val > 64) {
            TRACE("XM error: out-of-range envelope node (node_y[%d]=%d)\n", i, val);
            /* FT2 seems to simply clip the value */
            val = 64;
		}
        envelope->node_y[i] = (signed char)(val + y_offset);
	}

	return 0;
}